

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

boolean attack(monst *mtmp,schar dx,schar dy)

{
  permonst *ppVar1;
  bool bVar2;
  boolean bVar3;
  schar sVar4;
  byte bVar5;
  int iVar6;
  obj *poVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  char local_138 [8];
  char buf [256];
  char *p;
  boolean inshop;
  boolean foo;
  permonst *mdat;
  schar tmp;
  schar dy_local;
  schar dx_local;
  monst *mtmp_local;
  
  ppVar1 = mtmp->data;
  if ((mtmp != (monst *)0x0) && (mtmp->mtame != '\0')) {
    if (mtmp->wormno == '\0') {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((u.uprops[0x40].intrinsic != 0 ||
            ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
          (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))
      goto LAB_0031b6ae;
LAB_0031b73b:
      if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
           ((poVar7 = which_armor(mtmp,4), poVar7 != (obj *)0x0 &&
            (poVar7 = which_armor(mtmp,4), poVar7->otyp == 0x4f)))) ||
          ((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
             (((((u.uprops[0x19].intrinsic == 0 &&
                 ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
              (u.uprops[0x19].blocked != 0)))))) &&
           (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
            (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar6)))))) &&
         (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
          (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) goto LAB_0031bc80;
    }
    else {
      bVar3 = worm_known(level,mtmp);
      if (bVar3 == '\0') goto LAB_0031b73b;
LAB_0031b6ae:
      if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
            (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
          (((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 ||
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)))) || (((byte)u._1052_1_ >> 5 & 1) != 0))
      goto LAB_0031b73b;
    }
    if ((((flags.safe_dog != '\0') && (u.uprops[0x1c].intrinsic == 0)) &&
        (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))))) &&
       ((u.uprops[0x1b].intrinsic == 0 &&
        ((((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')) && (flags.forcefight == '\0'))
         && ((uwep == (obj *)0x0 || (uwep->oartifact != '\x03')))))))) {
      iVar6 = rn2(7);
      bVar11 = true;
      if ((iVar6 != 0) &&
         ((bVar11 = true, mtmp->data != mons + 0x74 && (bVar11 = true, mtmp->data != mons + 0x76))))
      {
        bVar11 = mtmp->data == mons + 0x158;
      }
      bVar2 = false;
      buf._248_8_ = in_rooms(level,mtmp->mx,mtmp->my,0x12);
      do {
        if (*(char *)buf._248_8_ == '\0') {
LAB_0031bb12:
          if (((bVar2) || (bVar11)) ||
             ((level->locations[u.ux][u.uy].typ < '\x11' && ((mtmp->data->mflags1 & 8) == 0)))) {
            iVar6 = rnd(6);
            monflee(mtmp,iVar6,'\0','\0');
            pcVar8 = y_monnam(mtmp);
            strcpy(local_138,pcVar8);
            local_138[0] = highc(local_138[0]);
            pline("You stop.  %s is in the way!",local_138);
            nomul(0,(char *)0x0);
            return '\x01';
          }
          if ((((mtmp->mfrozen != '\0') || ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0)) ||
              (mtmp->data->mmove == '\0')) && (iVar6 = rn2(6), iVar6 != 0)) {
            pcVar8 = Monnam(mtmp);
            pline("%s doesn\'t seem to move!",pcVar8);
            nomul(0,(char *)0x0);
            return '\x01';
          }
          return '\0';
        }
        bVar3 = tended_shop(level->rooms + (*(char *)buf._248_8_ + -3));
        if (bVar3 != '\0') {
          bVar2 = true;
          goto LAB_0031bb12;
        }
        buf._248_8_ = buf._248_8_ + 1;
      } while( true );
    }
  }
LAB_0031bc80:
  override_confirmation = '\0';
  bVar3 = attack_checks(mtmp,uwep,dx,dy,'\0');
  if (bVar3 != '\0') {
    return '\x01';
  }
  if ((u.umonnum == u.umonster) || (iVar6 = noattacks(youmonst.data), iVar6 == 0)) {
    bVar3 = check_capacity("You cannot fight while so heavily loaded.");
    if (bVar3 == '\0') {
      if ((u.twoweap != '\0') && (iVar6 = can_twoweapon(), iVar6 == 0)) {
        untwoweapon();
      }
      if ((unweapon != '\0') && (unweapon = '\0', flags.verbose != '\0')) {
        if (uwep == (obj *)0x0) {
          if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0')) {
            pcVar8 = "bash";
            if (urole.malenum == 0x160) {
              pcVar8 = "strik";
            }
            pcVar9 = "bare";
            if (uarmg != (obj *)0x0) {
              pcVar9 = "gloved";
            }
            pcVar10 = body_part(6);
            pcVar10 = makeplural(pcVar10);
            pline("You begin %sing monsters with your %s %s.",pcVar8,pcVar9,pcVar10);
          }
        }
        else {
          pcVar8 = aobjnam(uwep,(char *)0x0);
          pline("You begin bashing monsters with your %s.",pcVar8);
        }
      }
      exercise(0,'\x01');
      u_wipe_engr(3);
      if (((((ppVar1->mlet == '\f') && (mtmp->mfrozen == '\0')) &&
           ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0)) &&
          ((((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) == 0 &&
            ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) != 0)) && (iVar6 = rn2(7), iVar6 == 0)))) &&
         (((iVar6 = m_move(mtmp,0), iVar6 == 2 || ((int)mtmp->mx != (int)u.ux + (int)dx)) ||
          ((int)mtmp->my != (int)u.uy + (int)dy)))) {
        return '\0';
      }
      sVar4 = find_roll_to_hit(mtmp);
      if ((u.umonnum == u.umonster) && (urace.malenum != 0xe8)) {
        hitum(mtmp,(int)sVar4,(youmonst.data)->mattk,dx,dy);
      }
      else {
        hmonas(mtmp,(int)sVar4,dx,dy);
      }
      mtmp->mstrategy = mtmp->mstrategy & 0xcfffffff;
    }
  }
  else {
    pline("You have no way to attack monsters physically.");
    mtmp->mstrategy = mtmp->mstrategy & 0xcfffffff;
  }
  if (flags.forcefight == '\0') {
    return '\x01';
  }
  if (mtmp->mhp < 1) {
    return '\x01';
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (((((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
          ((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
         ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_0031c1cc;
      bVar5 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x0031c139;
    }
  }
  else {
    bVar5 = worm_known(level,mtmp);
joined_r0x0031c139:
    if (bVar5 == 0) goto LAB_0031c1cc;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
      && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    return '\x01';
  }
LAB_0031c1cc:
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar7 = which_armor(mtmp,4), poVar7 != (obj *)0x0 &&
        (poVar7 = which_armor(mtmp,4), poVar7->otyp == 0x4f)))) ||
      ((((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
         ((((u.uprops[0x19].intrinsic == 0 &&
            ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
           (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))) ||
        (u.uprops[0x19].blocked != 0)) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar6)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (((bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0' &&
        ((*(uint *)&level->locations[(int)u.ux + (int)dx][(int)u.uy + (int)dy].field_0x6 >> 3 & 1)
         == 0)) && (((u._1052_1_ & 1) == 0 || (mtmp != u.ustuck)))))))) {
    map_invisible(u.ux + dx,u.uy + dy);
  }
  return '\x01';
}

Assistant:

boolean attack(struct monst *mtmp, schar dx, schar dy)
{
	schar tmp;
	const struct permonst *mdat = mtmp->data;

	/* This section of code provides protection against accidentally
	 * hitting peaceful (like '@') and tame (like 'd') monsters.
	 * Protection is provided as long as player is not: blind, confused,
	 * hallucinating or stunned.
	 * changes by wwp 5/16/85
	 * More changes 12/90, -dkh-. if its tame and safepet, (and protected
	 * 07/92) then we assume that you're not trying to attack. Instead,
	 * you'll usually just swap places if this is a movement command
	 */
	/* Intelligent chaotic weapons (Stormbringer) want blood */
	if (is_safepet(level, mtmp) && !flags.forcefight) {
	    if (!uwep || uwep->oartifact != ART_STORMBRINGER) {
		/* there are some additional considerations: this won't work
		 * if in a shop or you miss a random roll or
		 * if you can walk thru walls and your pet cannot (KAA) or
		 * if your pet is a long worm (unless someone does better).
		 * there's also a chance of displacing a "frozen" monster.
		 * sleeping monsters might magically walk in their sleep.
		 */
		boolean foo = (!rn2(7) || is_longworm(mtmp->data)),
			inshop = FALSE;
		char *p;

		for (p = in_rooms(level, mtmp->mx, mtmp->my, SHOPBASE); *p; p++)
		    if (tended_shop(&level->rooms[*p - ROOMOFFSET])) {
			inshop = TRUE;
			break;
		    }

		if (inshop || foo ||
			(IS_ROCK(level->locations[u.ux][u.uy].typ) &&
					!passes_walls(mtmp->data))) {
		    char buf[BUFSZ];

		    monflee(mtmp, rnd(6), FALSE, FALSE);
		    strcpy(buf, y_monnam(mtmp));
		    buf[0] = highc(buf[0]);
		    pline("You stop.  %s is in the way!", buf);
		    nomul(0, NULL);
		    return TRUE;
		} else if ((mtmp->mfrozen || (! mtmp->mcanmove)
				|| (mtmp->data->mmove == 0)) && rn2(6)) {
		    pline("%s doesn't seem to move!", Monnam(mtmp));
		    nomul(0, NULL);
		    return TRUE;
		} else return FALSE;
	    }
	}

	/* possibly set in attack_checks;
	   examined in known_hitum, called via hitum or hmonas below */
	override_confirmation = FALSE;
	if (attack_checks(mtmp, uwep, dx, dy, FALSE))
	    return TRUE;

	if (Upolyd) {
		/* certain "pacifist" monsters don't attack */
		if (noattacks(youmonst.data)) {
			pline("You have no way to attack monsters physically.");
			mtmp->mstrategy &= ~STRAT_WAITMASK;
			goto atk_done;
		}
	}

	if (check_capacity("You cannot fight while so heavily loaded."))
	    goto atk_done;

	if (u.twoweap && !can_twoweapon())
		untwoweapon();

	if (unweapon) {
	    unweapon = FALSE;
	    if (flags.verbose) {
		if (uwep)
		    pline("You begin bashing monsters with your %s.",
			aobjnam(uwep, NULL));
		else if (!cantwield(youmonst.data))
		    pline("You begin %sing monsters with your %s %s.",
			Role_if (PM_MONK) ? "strik" : "bash",
			uarmg ? "gloved" : "bare",	/* Del Lamb */
			makeplural(body_part(HAND)));
	    }
	}
	exercise(A_STR, TRUE);		/* you're exercising muscles */
	/* andrew@orca: prevent unlimited pick-axe attacks */
	u_wipe_engr(3);

	/* Is the "it died" check actually correct? */
	if (mdat->mlet == S_LEPRECHAUN && !mtmp->mfrozen && !mtmp->msleeping &&
	   !mtmp->mconf && mtmp->mcansee && !rn2(7) &&
	   (m_move(mtmp, 0) == 2 ||			    /* it died */
	   mtmp->mx != u.ux + dx || mtmp->my != u.uy + dy)) /* it moved */
		return FALSE;

	tmp = find_roll_to_hit(mtmp);
	if (Upolyd || Race_if(PM_VAMPIRE))
		hmonas(mtmp, tmp, dx, dy);
	else
		hitum(mtmp, tmp, youmonst.data->mattk, dx, dy);
	mtmp->mstrategy &= ~STRAT_WAITMASK;

atk_done:
	/* see comment in attack_checks() */
	/* we only need to check for this if we did an attack_checks()
	 * and it returned 0 (it's okay to attack), and the monster didn't
	 * evade.
	 */
	if (flags.forcefight && mtmp->mhp > 0 && !canspotmon(level, mtmp) &&
	    !level->locations[u.ux+dx][u.uy+dy].mem_invis &&
	    !(u.uswallow && mtmp == u.ustuck))
		map_invisible(u.ux+dx, u.uy+dy);

	return TRUE;
}